

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O2

void av1_setup_in_frame_q_adj(AV1_COMP *cpi)

{
  segmentation *seg;
  int q_index;
  RefCntBuffer *pRVar1;
  int seg_data;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  long lVar5;
  
  q_index = (cpi->common).quant_params.base_qindex;
  seg = &(cpi->common).seg;
  pRVar1 = (cpi->common).prev_frame;
  if ((pRVar1 == (RefCntBuffer *)0x0) ||
     (((cpi->common).width == pRVar1->width && ((cpi->common).height == pRVar1->height)))) {
    _Var2 = is_frame_aq_enabled(cpi);
    if (!_Var2) {
      return;
    }
    uVar3 = get_aq_c_strength(q_index,((cpi->common).seq_params)->bit_depth);
    memset((cpi->enc_seg).map,3,
           (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
    av1_clearall_segfeatures(seg);
    if (0xff < (cpi->rc).sb64_target_rate) {
      av1_enable_segmentation(seg);
      lVar5 = 0;
      av1_disable_segfeature(seg,3,'\0');
      do {
        if (lVar5 != 3) {
          if (lVar5 == 5) {
            return;
          }
          iVar4 = av1_compute_qdelta_by_rate
                            (cpi,(cpi->common).current_frame.frame_type,q_index,
                             aq_c_q_adj_factor[uVar3][lVar5]);
          seg_data = iVar4;
          if (q_index + iVar4 == 0) {
            seg_data = 1 - q_index;
          }
          if (q_index == 0) {
            seg_data = iVar4;
          }
          if (seg_data + q_index != 0 && SCARRY4(seg_data,q_index) == seg_data + q_index < 0) {
            av1_enable_segfeature(seg,(int)lVar5,'\0');
            av1_set_segdata(seg,(int)lVar5,'\0',seg_data);
          }
        }
        lVar5 = lVar5 + 1;
      } while( true );
    }
  }
  else {
    memset((cpi->enc_seg).map,0,
           (long)(cpi->common).mi_params.mi_cols * (long)(cpi->common).mi_params.mi_rows);
    av1_clearall_segfeatures(seg);
  }
  av1_disable_segmentation(seg);
  return;
}

Assistant:

void av1_setup_in_frame_q_adj(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const int base_qindex = cm->quant_params.base_qindex;
  struct segmentation *const seg = &cm->seg;
  const int resolution_change =
      cm->prev_frame && (cm->width != cm->prev_frame->width ||
                         cm->height != cm->prev_frame->height);

  // Make SURE use of floating point in this function is safe.

  if (resolution_change) {
    memset(cpi->enc_seg.map, 0, cm->mi_params.mi_rows * cm->mi_params.mi_cols);
    av1_clearall_segfeatures(seg);
    av1_disable_segmentation(seg);
    return;
  }

  if (is_frame_aq_enabled(cpi)) {
    int segment;
    const int aq_strength =
        get_aq_c_strength(base_qindex, cm->seq_params->bit_depth);

    // Clear down the segment map.
    memset(cpi->enc_seg.map, DEFAULT_AQ2_SEG,
           cm->mi_params.mi_rows * cm->mi_params.mi_cols);

    av1_clearall_segfeatures(seg);

    if (!is_sb_aq_enabled(cpi)) {
      av1_disable_segmentation(seg);
      return;
    }

    av1_enable_segmentation(seg);

    // Default segment "Q" feature is disabled so it defaults to the baseline Q.
    av1_disable_segfeature(seg, DEFAULT_AQ2_SEG, SEG_LVL_ALT_Q);

    // Use some of the segments for in frame Q adjustment.
    for (segment = 0; segment < AQ_C_SEGMENTS; ++segment) {
      int qindex_delta;

      if (segment == DEFAULT_AQ2_SEG) continue;

      qindex_delta = av1_compute_qdelta_by_rate(
          cpi, cm->current_frame.frame_type, base_qindex,
          aq_c_q_adj_factor[aq_strength][segment]);

      // For AQ complexity mode, we dont allow Q0 in a segment if the base
      // Q is not 0. Q0 (lossless) implies 4x4 only and in AQ mode 2 a segment
      // Q delta is sometimes applied without going back around the rd loop.
      // This could lead to an illegal combination of partition size and q.
      if ((base_qindex != 0) && ((base_qindex + qindex_delta) == 0)) {
        qindex_delta = -base_qindex + 1;
      }
      if ((base_qindex + qindex_delta) > 0) {
        av1_enable_segfeature(seg, segment, SEG_LVL_ALT_Q);
        av1_set_segdata(seg, segment, SEG_LVL_ALT_Q, qindex_delta);
      }
    }
  }
}